

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fdabs_m68k(CPUM68KState_conflict *env,FPReg_conflict *res,FPReg_conflict *val)

{
  int val_00;
  floatx80 fVar1;
  floatx80 a;
  undefined6 uStack_2e;
  int old;
  FPReg_conflict *val_local;
  FPReg_conflict *res_local;
  CPUM68KState_conflict *env_local;
  
  val_00 = get_floatx80_rounding_precision(&env->fp_status);
  set_floatx80_rounding_precision(0x40,&env->fp_status);
  fVar1._10_6_ = 0;
  fVar1._0_10_ = *(unkuint10 *)val;
  fVar1 = floatx80_abs(fVar1);
  a._10_6_ = 0;
  a.low = (long)fVar1._0_10_;
  a.high = (short)(fVar1._0_10_ >> 0x40);
  fVar1 = floatx80_round_m68k(a,&env->fp_status);
  (res->d).low = fVar1.low;
  *(ulong *)&(res->d).high = CONCAT62(uStack_2e,fVar1.high);
  set_floatx80_rounding_precision(val_00,&env->fp_status);
  return;
}

Assistant:

void HELPER(fdabs)(CPUM68KState *env, FPReg *res, FPReg *val)
{
    PREC_BEGIN(64);
    res->d = floatx80_round(floatx80_abs(val->d), &env->fp_status);
    PREC_END();
}